

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,bool>
          (TryCast *this,string_t input,bool *result,bool strict)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char local_34;
  
  bVar1 = (byte)result;
  cVar2 = (char)((ulong)this >> 0x20);
  cVar10 = (char)((ulong)this >> 0x28);
  cVar9 = (char)((ulong)this >> 0x30);
  cVar11 = (char)((ulong)this >> 0x38);
  switch((int)this) {
  case 1:
    uVar4 = tolower((int)cVar2);
    uVar4 = uVar4 & 0xff;
    uVar8 = 1;
    if ((((uVar4 == 0x31 & (bVar1 ^ 1)) == 0) && (uVar4 != 0x74)) && (uVar4 != 0x79 || bVar1 != 0))
    {
      uVar8 = 0;
      if ((((uVar4 == 0x30 & (bVar1 ^ 1)) == 0) && (uVar4 != 0x66)) && (uVar4 != 0x6e || bVar1 != 0)
         ) {
        return false;
      }
    }
    break;
  case 2:
    iVar3 = tolower((int)cVar2);
    uVar4 = tolower((int)cVar10);
    if ((char)iVar3 != 'n') {
      return false;
    }
    uVar8 = 0;
    if ((uVar4 & 0xff) != 0x6f) {
      return false;
    }
    break;
  case 3:
    iVar3 = tolower((int)cVar2);
    uVar4 = tolower((int)cVar10);
    uVar5 = tolower((int)cVar9);
    if ((char)iVar3 != 'y') {
      return false;
    }
    if ((uVar4 & 0xff) != 0x65) {
      return false;
    }
    uVar8 = 1;
    if ((uVar5 & 0xff) != 0x73) {
      return false;
    }
    break;
  case 4:
    iVar3 = tolower((int)cVar2);
    uVar4 = tolower((int)cVar10);
    uVar5 = tolower((int)cVar9);
    uVar7 = tolower((int)cVar11);
    if ((char)iVar3 != 't') {
      return false;
    }
    if ((uVar4 & 0xff) != 0x72) {
      return false;
    }
    if ((uVar5 & 0xff) != 0x75) {
      return false;
    }
    uVar8 = 1;
    goto LAB_0023f59b;
  case 5:
    iVar3 = tolower((int)cVar2);
    uVar4 = tolower((int)cVar10);
    uVar5 = tolower((int)cVar9);
    uVar6 = tolower((int)cVar11);
    uVar7 = tolower((int)input.value._0_1_);
    local_34 = (char)iVar3;
    if (local_34 != 'f') {
      return false;
    }
    if ((uVar4 & 0xff) != 0x61) {
      return false;
    }
    if ((uVar5 & 0xff) != 0x6c) {
      return false;
    }
    if ((uVar6 & 0xff) != 0x73) {
      return false;
    }
    uVar8 = 0;
LAB_0023f59b:
    if ((uVar7 & 0xff) != 0x65) {
      return false;
    }
    break;
  default:
    return false;
  }
  *input.value._8_8_ = uVar8;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, bool &result, bool strict) {
	auto input_data = reinterpret_cast<const char *>(input.GetData());
	auto input_size = input.GetSize();
	return TryCastStringBool(input_data, input_size, result, strict);
}